

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_class.c
# Opt level: O2

int oonf_class_extension_add(oonf_class_extension *ext)

{
  oonf_class *ci;
  list_entity *plVar1;
  size_t sVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  
  if (((ext->_node).next == (list_entity *)0x0) ||
     (iVar4 = 0, (ext->_node).prev == (list_entity *)0x0)) {
    lVar3 = avl_find(&_classes_tree,ext->class_name);
    if (lVar3 == 0) {
      iVar4 = -1;
      if (((&log_global_mask)[_oonf_class_subsystem.logging] & 4) != 0) {
        oonf_log(4,(ulong)_oonf_class_subsystem.logging,"src/base/oonf_class.c",0x10b,0,0,
                 "Unknown class %s for extension %s",ext->class_name,ext->ext_name);
      }
    }
    else {
      ci = (oonf_class *)(lVar3 + -0x28);
      if ((*(int *)(lVar3 + 0x60) == 0) || (ext->size == 0)) {
        plVar1 = *(list_entity **)(lVar3 + 0x50);
        (ext->_node).next = (list_entity *)(lVar3 + 0x48);
        (ext->_node).prev = plVar1;
        *(list_entity **)(lVar3 + 0x50) = &ext->_node;
        plVar1->next = &ext->_node;
        iVar4 = 0;
        if (ext->size != 0) {
          _free_freelist(ci);
          sVar2 = *(size_t *)(lVar3 + -8);
          ext->_offset = sVar2;
          uVar5 = sVar2 + ext->size + 0xf & 0xfffffffffffffff0;
          *(ulong *)(lVar3 + -8) = uVar5;
          if (((&log_global_mask)[_oonf_class_subsystem.logging] & 1) != 0) {
            iVar4 = 0;
            oonf_log(1,(ulong)_oonf_class_subsystem.logging,"src/base/oonf_class.c",0x124,0,0,
                     "Class %s extended: %zu bytes, \'%s\' has offset %zu and length %zu\n",ci->name
                     ,uVar5,ext->ext_name,ext->_offset,ext->size);
          }
        }
      }
      else {
        iVar4 = -1;
        if (((&log_global_mask)[_oonf_class_subsystem.logging] & 4) != 0) {
          oonf_log(4,(ulong)_oonf_class_subsystem.logging,"src/base/oonf_class.c",0x110,0,0,
                   "Class %s is already in use and cannot be extended",ci->name);
        }
      }
    }
  }
  return iVar4;
}

Assistant:

int
oonf_class_extension_add(struct oonf_class_extension *ext) {
  struct oonf_class *c;

  if (oonf_class_is_extension_registered(ext)) {
    /* already registered */
    return 0;
  }

  c = avl_find_element(&_classes_tree, ext->class_name, c, _node);
  if (c == NULL) {
    OONF_WARN(LOG_CLASS, "Unknown class %s for extension %s", ext->class_name, ext->ext_name);
    return -1;
  }

  if (c->_allocated != 0 && ext->size > 0) {
    OONF_WARN(LOG_CLASS, "Class %s is already in use and cannot be extended", c->name);
    return -1;
  }

  /* add to class extension list */
  list_add_tail(&c->_extensions, &ext->_node);

  if (ext->size > 0) {
    /* make sure freelist is empty */
    _free_freelist(c);

    /* old size is new offset */
    ext->_offset = c->total_size;

    /* calculate new size */
    c->total_size = _roundup(c->total_size + ext->size);

    OONF_DEBUG(LOG_CLASS,
      "Class %s extended: %" PRINTF_SIZE_T_SPECIFIER " bytes,"
      " '%s' has offset %" PRINTF_SIZE_T_SPECIFIER " and length %" PRINTF_SIZE_T_SPECIFIER "\n",
      c->name, c->total_size, ext->ext_name, ext->_offset, ext->size);
  }

  return 0;
}